

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O2

void MapOptHandler_edata(FMapInfoParser *parse,level_info_t *info)

{
  FEDOptions *pFVar1;
  FName local_1c;
  
  FName::FName(&local_1c,"EData");
  pFVar1 = level_info_t::GetOptData<FEDOptions>(info,&local_1c,true);
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetString(&parse->sc);
  FString::operator=(&pFVar1->EDName,(parse->sc).String);
  return;
}

Assistant:

DEFINE_MAP_OPTION(edata, false)
{
	FEDOptions *opt = info->GetOptData<FEDOptions>("EData");

	parse.ParseAssign();
	parse.sc.MustGetString();
	opt->EDName = parse.sc.String;
}